

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

opj_bool dwt_decode_tile_v2(opj_tcd_tilecomp_v2_t *tilec,OPJ_UINT32 numres,DWT1DFN dwt_1D)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int x;
  OPJ_UINT32 OVar4;
  uint uVar5;
  opj_tcd_resolution_v2_t *poVar6;
  code *in_RDX;
  OPJ_UINT32 in_ESI;
  int *in_RDI;
  OPJ_UINT32 k;
  OPJ_UINT32 j;
  OPJ_INT32 *tiledp;
  OPJ_UINT32 w;
  OPJ_UINT32 rh;
  OPJ_UINT32 rw;
  opj_tcd_resolution_v2_t *tr;
  dwt_t v;
  dwt_t h;
  uint local_78;
  uint local_74;
  uint local_60;
  uint local_5c;
  opj_tcd_resolution_v2_t *local_58;
  dwt_t local_50;
  dwt_t local_38;
  code *local_20;
  OPJ_UINT32 local_14;
  int *local_10;
  opj_bool local_4;
  
  local_58 = *(opj_tcd_resolution_v2_t **)(in_RDI + 6);
  iVar1 = local_58->x1;
  iVar2 = local_58->x0;
  local_60 = local_58->y1 - local_58->y0;
  x = in_RDI[2] - *in_RDI;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  OVar4 = dwt_max_resolution_v2(local_58,in_ESI);
  local_50.mem = (int *)malloc((ulong)OVar4 << 2);
  local_5c = iVar1 - iVar2;
  local_38.mem = local_50.mem;
  if (local_50.mem == (int *)0x0) {
    local_4 = 0;
  }
  else {
    while (local_14 = local_14 - 1, local_14 != 0) {
      lVar3 = *(long *)(local_10 + 10);
      poVar6 = local_58 + 1;
      local_38.sn = local_5c;
      local_50.sn = local_60;
      uVar5 = local_58[1].x1 - poVar6->x0;
      local_60 = local_58[1].y1 - local_58[1].y0;
      local_38.dn = uVar5 - local_5c;
      local_38.cas = poVar6->x0 % 2;
      for (local_74 = 0; local_74 < local_60; local_74 = local_74 + 1) {
        dwt_interleave_h(&local_38,(int *)(lVar3 + (ulong)(local_74 * x) * 4));
        (*local_20)(&local_38);
        memcpy((void *)(lVar3 + (ulong)(local_74 * x) * 4),local_38.mem,(ulong)uVar5 << 2);
      }
      local_50.dn = local_60 - local_50.sn;
      local_50.cas = local_58[1].y0 % 2;
      for (local_74 = 0; local_5c = uVar5, local_58 = poVar6, local_74 < uVar5;
          local_74 = local_74 + 1) {
        dwt_interleave_v(&local_50,(int *)(lVar3 + (ulong)local_74 * 4),x);
        (*local_20)(&local_50);
        for (local_78 = 0; local_78 < local_60; local_78 = local_78 + 1) {
          *(int *)(lVar3 + (ulong)(local_78 * x + local_74) * 4) = local_50.mem[local_78];
        }
      }
    }
    free(local_38.mem);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static opj_bool dwt_decode_tile_v2(opj_tcd_tilecomp_v2_t* tilec, OPJ_UINT32 numres, DWT1DFN dwt_1D) {
	dwt_t h;
	dwt_t v;

	opj_tcd_resolution_v2_t* tr = tilec->resolutions;

	OPJ_UINT32 rw = tr->x1 - tr->x0;	/* width of the resolution level computed */
	OPJ_UINT32 rh = tr->y1 - tr->y0;	/* height of the resolution level computed */

	OPJ_UINT32 w = tilec->x1 - tilec->x0;

	h.mem = (OPJ_INT32*)
	opj_aligned_malloc(dwt_max_resolution_v2(tr, numres) * sizeof(OPJ_INT32));
	if
		(! h.mem)
	{
		return OPJ_FALSE;
	}

	v.mem = h.mem;

	while( --numres) {
		OPJ_INT32 * restrict tiledp = tilec->data;
		OPJ_UINT32 j;

		++tr;
		h.sn = rw;
		v.sn = rh;

		rw = tr->x1 - tr->x0;
		rh = tr->y1 - tr->y0;

		h.dn = rw - h.sn;
		h.cas = tr->x0 % 2;

		for(j = 0; j < rh; ++j) {
			dwt_interleave_h(&h, &tiledp[j*w]);
			(dwt_1D)(&h);
			memcpy(&tiledp[j*w], h.mem, rw * sizeof(OPJ_INT32));
		}

		v.dn = rh - v.sn;
		v.cas = tr->y0 % 2;

		for(j = 0; j < rw; ++j){
			OPJ_UINT32 k;
			dwt_interleave_v(&v, &tiledp[j], w);
			(dwt_1D)(&v);
			for(k = 0; k < rh; ++k) {
				tiledp[k * w + j] = v.mem[k];
			}
		}
	}
	opj_aligned_free(h.mem);
	return OPJ_TRUE;
}